

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Function * __thiscall wasm::Module::getFunction(Module *this,Name name)

{
  mapped_type pFVar1;
  mapped_type *ppFVar2;
  string *in_R8;
  Name name_00;
  allocator<char> local_59;
  string local_58 [32];
  Module *local_38;
  char *pcStack_30;
  Module *local_20;
  Module *this_local;
  Name name_local;
  
  pcStack_30 = name.super_IString.str._M_str;
  local_38 = name.super_IString.str._M_len;
  local_20 = this;
  this_local = local_38;
  name_local.super_IString.str._M_len = (size_t)pcStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getFunction",&local_59);
  name_00.super_IString.str._M_str = (char *)local_58;
  name_00.super_IString.str._M_len = (size_t)pcStack_30;
  ppFVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>>>
                      ((wasm *)&this->functionsMap,
                       (unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
                        *)local_38,name_00,in_R8);
  pFVar1 = *ppFVar2;
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  return pFVar1;
}

Assistant:

Function* Module::getFunction(Name name) {
  return getModuleElement(functionsMap, name, "getFunction");
}